

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

bool __thiscall
ctemplate::TemplateCache::LoadTemplate(TemplateCache *this,TemplateString *filename,Strip strip)

{
  RefcountedTemplate *pRVar1;
  WriterMutexLock local_40;
  WriterMutexLock ml;
  undefined1 local_30 [8];
  TemplateCacheKey cache_key;
  Strip strip_local;
  TemplateString *filename_local;
  TemplateCache *this_local;
  
  cache_key._12_4_ = strip;
  ml.mu_ = (Mutex *)TemplateString::GetGlobalId(filename);
  std::pair<unsigned_long,_int>::pair<unsigned_long,_ctemplate::Strip_&,_true>
            ((pair<unsigned_long,_int> *)local_30,(unsigned_long *)&ml,(Strip *)&cache_key.field_0xc
            );
  WriterMutexLock::WriterMutexLock(&local_40,this->mutex_);
  pRVar1 = GetTemplateLocked(this,filename,cache_key._12_4_,(pair<unsigned_long,_int> *)local_30);
  WriterMutexLock::~WriterMutexLock(&local_40);
  return pRVar1 != (RefcountedTemplate *)0x0;
}

Assistant:

bool TemplateCache::LoadTemplate(const TemplateString& filename, Strip strip) {
  TemplateCacheKey cache_key = TemplateCacheKey(filename.GetGlobalId(), strip);
  WriterMutexLock ml(mutex_);
  return GetTemplateLocked(filename, strip, cache_key) != NULL;
}